

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  value_type vVar10;
  
  pFVar3 = (((((fadexpr->fadexpr_).left_)->fadexpr_).left_)->fadexpr_).left_;
  uVar1 = *(uint *)(*(long *)&pFVar3->fadexpr_ + 8);
  uVar2 = ((*(Fad<double> **)((long)&pFVar3->fadexpr_ + 8))->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar9 = (long)(int)uVar2 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar9);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar2 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).left_;
    pFVar3 = (pFVar5->fadexpr_).left_;
    if ((*(int *)(*(long *)&pFVar3->fadexpr_ + 8) == 0) ||
       (((*(Fad<double> **)((long)&pFVar3->fadexpr_ + 8))->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          vVar10 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar9);
          pdVar8[uVar9] = vVar10;
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
    }
    else if (0 < (int)uVar2) {
      lVar6 = *(long *)(*(long *)&pFVar3->fadexpr_ + 0x10);
      pdVar7 = *(double **)((long)&(*(Fad<double> **)((long)&pFVar3->fadexpr_ + 8))->dx_ + 8);
      uVar9 = 0;
      do {
        pdVar8[uVar9] =
             ((*(double *)(lVar6 + uVar9 * 8) - pdVar7[uVar9]) * (pFVar5->fadexpr_).right_.constant_
             * (pFVar4->fadexpr_).right_.constant_) / (fadexpr->fadexpr_).right_.constant_;
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar3 = (pFVar5->fadexpr_).left_;
  this->val_ = ((**(double **)&pFVar3->fadexpr_ -
                (*(Fad<double> **)((long)&pFVar3->fadexpr_ + 8))->val_) *
                (pFVar5->fadexpr_).right_.constant_ * (pFVar4->fadexpr_).right_.constant_) /
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}